

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::GenerateBuildCommand
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeCommand,string *makeProgram,string *param_3,string *param_4,string *targetName,
          string *param_6,bool fast,bool param_8,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makeOptions)

{
  pointer ppcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  Snapshot snapshot;
  int iVar4;
  cmLocalGenerator *pcVar5;
  char *pcVar6;
  size_type sVar7;
  string local_a8;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  Snapshot local_48;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  cmGlobalGenerator::SelectMakeProgram
            (&local_a8,&this->super_cmGlobalGenerator,makeProgram,&local_88);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             &local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[2])(local_68,this);
  iVar4 = strncmp((char *)local_68[0],"NMake Makefiles",0xf);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (iVar4 == 0) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/NOLOGO","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
               &local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)makeCommand,
             (makeCommand->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,
             (makeOptions->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  sVar7 = targetName->_M_string_length;
  if (sVar7 != 0) {
    ppcVar1 = (this->super_cmGlobalGenerator).LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar1 ==
        (this->super_cmGlobalGenerator).LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
      snapshot.Position.Tree = local_48.Position.Tree;
      snapshot.State = local_48.State;
      snapshot.Position.Position = local_48.Position.Position;
      pcVar5 = cmGlobalGenerator::MakeLocalGenerator
                         (&this->super_cmGlobalGenerator,snapshot,(cmLocalGenerator *)0x0);
      pcVar2 = pcVar5->Makefile;
      pcVar6 = cmake::GetHomeDirectory((this->super_cmGlobalGenerator).CMakeInstance);
      std::__cxx11::string::string((string *)&local_a8,pcVar6,(allocator *)&local_88);
      cmMakefile::SetCurrentSourceDirectory(pcVar2,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = pcVar5->Makefile;
      pcVar6 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
      std::__cxx11::string::string((string *)&local_a8,pcVar6,(allocator *)&local_88);
      cmMakefile::SetCurrentBinaryDirectory(pcVar2,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      sVar7 = targetName->_M_string_length;
    }
    else {
      pcVar5 = *ppcVar1;
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    pcVar3 = (targetName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a8,pcVar3,pcVar3 + sVar7);
    if (fast) {
      std::__cxx11::string::append((char *)&local_a8);
    }
    cmOutputConverter::Convert
              (&local_88,&pcVar5->super_cmOutputConverter,&local_a8,HOME_OUTPUT,UNCHANGED);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::ConvertToOutputSlashes(&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(makeCommand,&local_a8);
    if (pcVar5 != (cmLocalGenerator *)0x0 &&
        (this->super_cmGlobalGenerator).LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->super_cmGlobalGenerator).LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      (*pcVar5->_vptr_cmLocalGenerator[1])(pcVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::GenerateBuildCommand(std::vector<std::string>& makeCommand,
                       const std::string& makeProgram,
                       const std::string& /*projectName*/,
                       const std::string& /*projectDir*/,
                       const std::string& targetName,
                       const std::string& /*config*/,
                       bool fast, bool /*verbose*/,
                       std::vector<std::string> const& makeOptions)
{
  makeCommand.push_back(
    this->SelectMakeProgram(makeProgram)
    );

  // Since we have full control over the invocation of nmake, let us
  // make it quiet.
  if (cmHasLiteralPrefix(this->GetName(), "NMake Makefiles"))
    {
    makeCommand.push_back("/NOLOGO");
    }
  makeCommand.insert(makeCommand.end(),
                     makeOptions.begin(), makeOptions.end());
  if (!targetName.empty())
    {
    cmLocalUnixMakefileGenerator3 *lg;
    if (!this->LocalGenerators.empty())
      {
      lg = static_cast<cmLocalUnixMakefileGenerator3 *>
        (this->LocalGenerators[0]);
      }
    else
      {
      lg = static_cast<cmLocalUnixMakefileGenerator3 *>
        (this->MakeLocalGenerator());
      // set the Start directories
      lg->GetMakefile()->SetCurrentSourceDirectory
        (this->CMakeInstance->GetHomeDirectory());
      lg->GetMakefile()->SetCurrentBinaryDirectory
        (this->CMakeInstance->GetHomeOutputDirectory());
      }

    std::string tname = targetName;
    if(fast)
      {
      tname += "/fast";
      }
    tname = lg->Convert(tname,cmLocalGenerator::HOME_OUTPUT);
    cmSystemTools::ConvertToOutputSlashes(tname);
    makeCommand.push_back(tname);
    if (this->LocalGenerators.empty())
      {
      delete lg;
      }
    }
}